

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::RemoveEdgeFromArray(ON_SubDVertex *this,ON_SubDEdge *e)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  unsigned_short vei;
  ulong uVar3;
  ushort uVar4;
  ulong uVar5;
  
  if (e != (ON_SubDEdge *)0x0) {
    uVar1 = this->m_edge_count;
    if (((ulong)uVar1 != 0) && (pOVar2 = this->m_edges, pOVar2 != (ON_SubDEdgePtr *)0x0)) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        if ((ON_SubDEdge *)(pOVar2[uVar3].m_ptr & 0xfffffffffffffff8) != e) {
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          pOVar2[uVar5].m_ptr = pOVar2[uVar3].m_ptr;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      if (uVar4 == uVar1) {
        return false;
      }
      this->m_edge_count = uVar4;
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::RemoveEdgeFromArray(const ON_SubDEdge * e)
{
  if (nullptr == e || 0 == m_edge_count || nullptr == m_edges)
    return ON_SUBD_RETURN_ERROR(false);
  unsigned short new_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdgePtr eptr = m_edges[vei];
    if (e == ON_SUBD_EDGE_POINTER(eptr.m_ptr))
      continue;
    m_edges[new_count++] = eptr;
  }
  if (new_count == m_edge_count)
    return false;
  m_edge_count = new_count;
  return true;
}